

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  pointer pcVar1;
  char cVar2;
  int iVar3;
  istream *piVar4;
  GLFWwindow *handle;
  GLFWmonitor *handle_00;
  int height;
  ulong uVar5;
  char *pcVar6;
  string token;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text;
  string cmd;
  string line;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  split_cmds;
  char buffer [32];
  ifstream input_stream;
  stringstream ss;
  value_type local_498;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_478;
  long *local_458 [2];
  long local_448 [2];
  value_type local_438;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_418;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_400;
  char local_3e8 [40];
  long local_3c0 [4];
  byte abStack_3a0 [488];
  stringstream local_1b8 [128];
  ios_base local_138 [264];
  
  printf("Enter Options File (max 32 chars): ");
  __isoc99_scanf(" %32s",local_3e8);
  printf("Initialzed using option file [%s]\n",local_3e8);
  dls[0][0] = 0.0;
  dls[0][1] = 0.0;
  dls[0][2] = 0.0;
  dl_cs[0][0] = 0.0;
  dl_cs[0][1] = 0.0;
  dl_cs[0][2] = 0.0;
  pls[0][0] = 0.0;
  pls[0][1] = 0.0;
  pls[0][2] = 0.0;
  pl_cs[0][0] = 0.0;
  pl_cs[0][1] = 0.0;
  pl_cs[0][2] = 0.0;
  std::ifstream::ifstream((istream *)local_3c0,local_3e8,_S_in);
  if ((abStack_3a0[*(long *)(local_3c0[0] + -0x18)] & 5) != 0) {
    printf("Can\'t open the option file, using default.");
    dls[0][0] = 1.0;
    dls[0][1] = 1.0;
    dls[0][2] = 0.8;
    dl_cs[0][0] = 0.8;
    dl_cs[0][1] = 0.8;
    dl_cs[0][2] = 0.8;
  }
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_478.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  local_438._M_string_length = 0;
  local_438.field_2._M_local_buf[0] = '\0';
  while( true ) {
    cVar2 = std::ios::widen((char)*(undefined8 *)(local_3c0[0] + -0x18) + (char)(istream *)local_3c0
                           );
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_3c0,(string *)&local_438,cVar2);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&local_478,&local_438);
  }
  std::ifstream::close();
  if (local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_478.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      local_458[0] = local_448;
      pcVar1 = local_478.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_458,pcVar1,
                 pcVar1 + local_478.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_string_length);
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_418.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::stringstream::stringstream(local_1b8,(string *)local_458,_S_out|_S_in);
      local_498._M_dataplus._M_p = (pointer)&local_498.field_2;
      local_498._M_string_length = 0;
      local_498.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)local_1b8,(string *)&local_498,' ');
        if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_418,&local_498);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_400,&local_418);
      read_cmd_tokens(&local_400);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_400);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_498._M_dataplus._M_p != &local_498.field_2) {
        operator_delete(local_498._M_dataplus._M_p,
                        CONCAT71(local_498.field_2._M_allocated_capacity._1_7_,
                                 local_498.field_2._M_local_buf[0]) + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_418);
      if (local_458[0] != local_448) {
        operator_delete(local_458[0],local_448[0] + 1);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)local_478.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_478.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  glfwInit();
  iVar3 = Height_global;
  handle = glfwCreateWindow(Width_global,Height_global,"Computer Graphics",(GLFWmonitor *)0x0,
                            (GLFWwindow *)0x0);
  if (handle == (GLFWwindow *)0x0) {
    pcVar6 = "Error on window creating";
  }
  else {
    handle_00 = glfwGetPrimaryMonitor();
    VideoMode_global = glfwGetVideoMode(handle_00);
    if (VideoMode_global != (GLFWvidmode *)0x0) {
      glfwMakeContextCurrent(handle);
      size_callback(handle,iVar3,height);
      glfwSetWindowSizeCallback(handle,size_callback);
      glfwSetKeyCallback(handle,key_callback);
      while( true ) {
        iVar3 = glfwWindowShouldClose(handle);
        if (iVar3 != 0) break;
        display(handle);
        glfwPollEvents();
      }
      iVar3 = 0;
      goto LAB_0010c994;
    }
    pcVar6 = "Error on getting monitor";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,0x18);
  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x58);
  std::ostream::put(-0x58);
  std::ostream::flush();
  iVar3 = -1;
  glfwTerminate();
LAB_0010c994:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,
                    CONCAT71(local_438.field_2._M_allocated_capacity._1_7_,
                             local_438.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_478);
  std::ifstream::~ifstream(local_3c0);
  return iVar3;
}

Assistant:

int main(int argc, char *argv[]) {

    //take user input
    char buffer[32];
    printf("Enter Options File (max 32 chars): ");
    scanf(" %32s", buffer);
    printf("Initialzed using option file [%s]\n", buffer);

    //initialize lights
    vec3 zero = {0.0f, 0.0f, 0.0f};
    for(int i=0; i<5; i++){
        change_light(dls, dl_cs, 0, zero, zero);
        change_light(pls, pl_cs, 0, zero, zero);
    }

    //open option file and record variables
    ifstream input_stream(buffer);
    if(!input_stream){
        printf("Can't open the option file, using default.");
        //add a default directional light
        vec3 l = {1.0f, 1.0f, 0.8f};
        vec3 cl = {0.8f, 0.8f, 0.8f};
        change_light(dls, dl_cs, 0, l, cl);
    }
    
    //read lines for values
    vector<string> text;
    string line;
    while(getline(input_stream, line)) text.push_back(line);
    input_stream.close();
    for(int i=0; i<text.size();i++){
        string cmd = text[i];
        vector<string> split_cmds;
        stringstream ss(cmd);
        string token;
        while(getline(ss, token, ' ')) split_cmds.push_back(token);
        read_cmd_tokens(split_cmds);
    }

    //This initializes glfw
    initializeRendering();
    
    GLFWwindow* window = glfwCreateWindow( Width_global, Height_global, "Computer Graphics", NULL, NULL );
    if ( !window )
    {
        cerr << "Error on window creating" << endl;
        glfwTerminate();
        return -1;
    }
    
    VideoMode_global = glfwGetVideoMode(glfwGetPrimaryMonitor());
    if ( !VideoMode_global )
    {
        cerr << "Error on getting monitor" << endl;
        glfwTerminate();
        return -1;
    }
    
    glfwMakeContextCurrent( window );

    size_callback(window, 0, 0);
    
    glfwSetWindowSizeCallback(window, size_callback);
    glfwSetKeyCallback(window, key_callback);
                
    while( !glfwWindowShouldClose( window ) ) // main loop to draw object again and again
    {
        display( window );

        glfwPollEvents();        
    }

    return 0;
}